

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_uescape_key(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  char *pcVar10;
  long lVar11;
  int *piVar12;
  double *pdVar13;
  long *plVar14;
  undefined8 extraout_RAX;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  int *piVar18;
  ulong uVar19;
  char *pcVar20;
  ulong uVar21;
  ulong unaff_R12;
  undefined1 *unaff_R13;
  undefined **ppuVar22;
  void *unaff_R14;
  void *unaff_R15;
  undefined **ppuVar23;
  int *piVar24;
  double dVar25;
  int extraout_XMM0_Db;
  bson_t b;
  bson_error_t error;
  code **ppcVar26;
  undefined4 uStack_315c;
  undefined8 uStack_3158;
  undefined2 uStack_3150;
  int iStack_3148;
  int iStack_3144;
  char acStack_3140 [504];
  code *pcStack_2f48;
  undefined1 auStack_2f38 [512];
  char *pcStack_2d38;
  code *pcStack_2d30;
  int iStack_2d20;
  int iStack_2d1c;
  char acStack_2d18 [504];
  long *plStack_2b20;
  double *pdStack_2b18;
  char *pcStack_2b10;
  code *pcStack_2b08;
  long lStack_2a90;
  long lStack_2a88;
  undefined1 auStack_2a80 [128];
  undefined1 auStack_2a00 [232];
  undefined1 auStack_2918 [608];
  long *plStack_26b8;
  code *pcStack_26b0;
  undefined1 auStack_26a8 [8];
  char acStack_26a0 [16];
  char *pcStack_2690;
  code *pcStack_2688;
  uint uStack_2604;
  undefined8 uStack_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 uStack_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 auStack_2538 [648];
  int *piStack_22b0;
  double *pdStack_22a8;
  undefined **ppuStack_22a0;
  int *piStack_2298;
  int *piStack_2290;
  code *pcStack_2288;
  undefined1 auStack_2280 [240];
  undefined1 auStack_2190 [648];
  code *apcStack_1f08 [16];
  double dStack_1e88;
  int aiStack_1e80 [50];
  int iStack_1db8;
  int iStack_1db4;
  int aiStack_1db0 [160];
  int *piStack_1b30;
  double *pdStack_1b28;
  undefined **ppuStack_1b20;
  int *piStack_1b18;
  int *piStack_1b10;
  code *apcStack_1b08 [16];
  double dStack_1a88;
  int aiStack_1a80 [50];
  int iStack_19b8;
  int iStack_19b4;
  int aiStack_19b0 [160];
  undefined8 uStack_1730;
  undefined1 *puStack_1728;
  char *pcStack_1720;
  char *pcStack_1718;
  undefined **ppuStack_1710;
  code *pcStack_1708;
  int iStack_1700;
  int iStack_16fc;
  char acStack_16f8 [504];
  undefined1 auStack_1500 [336];
  char *pcStack_13b0;
  ulong uStack_13a8;
  undefined1 *puStack_13a0;
  void *pvStack_1398;
  void *pvStack_1390;
  code *pcStack_1388;
  undefined1 auStack_1380 [128];
  char acStack_1300 [232];
  undefined1 auStack_1218 [648];
  char *pcStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [128];
  char acStack_f00 [224];
  int iStack_e20;
  int iStack_e1c;
  char acStack_e18 [640];
  char *pcStack_b98;
  void *pvStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [128];
  char acStack_b00 [232];
  undefined1 auStack_a18 [648];
  char *pcStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [232];
  int iStack_698;
  int iStack_694;
  char acStack_690 [640];
  char *pcStack_410;
  code *apcStack_408 [16];
  uint local_384;
  undefined1 local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  apcStack_408[0] = (code *)0x131d90;
  uVar5 = bson_bcon_magic();
  apcStack_408[0] = (code *)0x131daf;
  pcVar6 = (char *)bcon_new(0,anon_var_dwarf_49b7 + 0xc,uVar5,0,"euro",0);
  apcStack_408[0] = (code *)0x131dd5;
  cVar1 = bson_init_from_json(local_380,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,local_2b8);
  if (cVar1 == '\0') {
LAB_00131f51:
    apcStack_408[0] = (code *)0x131f56;
    test_bson_json_uescape_key_cold_1();
LAB_00131f56:
    apcStack_408[0] = (code *)0x131f5b;
    test_bson_json_uescape_key_cold_6();
LAB_00131f5b:
    apcStack_408[0] = (code *)0x131f60;
    test_bson_json_uescape_key_cold_5();
LAB_00131f60:
    apcStack_408[0] = (code *)0x131f65;
    test_bson_json_uescape_key_cold_2();
  }
  else {
    apcStack_408[0] = (code *)0x131ded;
    unaff_R15 = (void *)bson_get_data(local_380);
    apcStack_408[0] = (code *)0x131df8;
    unaff_R14 = (void *)bson_get_data(pcVar6);
    if (*(uint *)(pcVar6 + 4) == local_37c) {
      apcStack_408[0] = (code *)0x131e0d;
      pvVar7 = (void *)bson_get_data(pcVar6);
      apcStack_408[0] = (code *)0x131e1d;
      pvVar8 = (void *)bson_get_data(local_380);
      apcStack_408[0] = (code *)0x131e2b;
      iVar2 = bcmp(pvVar7,pvVar8,(ulong)*(uint *)(pcVar6 + 4));
      if (iVar2 == 0) {
        apcStack_408[0] = (code *)0x131e3c;
        bson_destroy(local_380);
        apcStack_408[0] = (code *)0x131e44;
        bson_destroy(pcVar6);
        return;
      }
    }
    unaff_R13 = local_380;
    apcStack_408[0] = (code *)0x131e65;
    uVar5 = bson_as_canonical_extended_json(unaff_R13);
    apcStack_408[0] = (code *)0x131e72;
    uVar9 = bson_as_canonical_extended_json(pcVar6);
    uVar17 = 0xffffffff;
    if (local_37c != 0) {
      uVar19 = 0;
      do {
        if (*(int *)(pcVar6 + 4) == (int)uVar19) break;
        if (*(char *)((long)unaff_R15 + uVar19) != *(char *)((long)unaff_R14 + uVar19)) {
          uVar17 = uVar19 & 0xffffffff;
          break;
        }
        uVar19 = uVar19 + 1;
      } while (local_37c != (uint)uVar19);
    }
    if ((int)uVar17 == -1) {
      uVar3 = local_37c;
      if (local_37c < *(uint *)(pcVar6 + 4)) {
        uVar3 = *(uint *)(pcVar6 + 4);
      }
      uVar17 = (ulong)(uVar3 - 1);
    }
    apcStack_408[0] = (code *)0x131ecd;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17,uVar5,uVar9);
    apcStack_408[0] = (code *)0x131ee5;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    unaff_R12 = (ulong)uVar3;
    apcStack_408[0] = (code *)0x131f00;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    local_384 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_00131f56;
    unaff_R13 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131f5b;
    unaff_R12 = (ulong)local_37c;
    apcStack_408[0] = (code *)0x131f2a;
    uVar17 = write(uVar3,unaff_R15,unaff_R12);
    if (uVar17 != unaff_R12) goto LAB_00131f60;
    pcVar6 = (char *)(ulong)*(uint *)(pcVar6 + 4);
    apcStack_408[0] = (code *)0x131f40;
    pcVar10 = (char *)write(uVar4,unaff_R14,(size_t)pcVar6);
    if (pcVar10 == pcVar6) {
      apcStack_408[0] = (code *)0x131f51;
      test_bson_json_uescape_key_cold_4();
      goto LAB_00131f51;
    }
  }
  apcStack_408[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_788 = (code *)0x131f98;
  pcStack_410 = pcVar6;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_init_from_json(auStack_780,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_698);
  if (cVar1 == '\0') {
    if (iStack_698 != 1) goto LAB_00131fe4;
    if (iStack_694 != 1) goto LAB_00131fe9;
    pcVar6 = acStack_690;
    pcStack_788 = (code *)0x131fcb;
    pcVar10 = strstr(pcVar6,"UESCAPE_TOOSHORT");
    if (pcVar10 != (char *)0x0) {
      pcStack_788 = (code *)0x131fd8;
      bson_destroy(auStack_780);
      return;
    }
  }
  else {
    pcStack_788 = (code *)0x131fe4;
    test_bson_json_uescape_bad_cold_4();
LAB_00131fe4:
    pcStack_788 = (code *)0x131fe9;
    test_bson_json_uescape_bad_cold_1();
LAB_00131fe9:
    pcStack_788 = (code *)0x131fee;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_788 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_b88 = (code *)0x132029;
  pcStack_790 = pcVar6;
  pcStack_788 = (code *)apcStack_408;
  cVar1 = bson_init_from_json(acStack_b00,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_a18);
  if (cVar1 == '\0') {
LAB_0013221b:
    pcStack_b88 = (code *)0x132228;
    test_bson_json_int32_cold_1();
LAB_00132228:
    pcStack_b88 = (code *)0x132230;
    test_bson_json_int32_cold_4();
LAB_00132230:
    pcStack_b88 = (code *)0x13223d;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_b88 = (code *)0x132048;
    cVar1 = bson_iter_init_find(auStack_b80,acStack_b00,"x");
    if (cVar1 == '\0') {
      pcStack_b88 = (code *)0x1321f8;
      test_bson_json_int32_cold_2();
LAB_001321f8:
      pcStack_b88 = (code *)0x1321fd;
      test_bson_json_int32_cold_3();
LAB_001321fd:
      pcStack_b88 = (code *)0x132202;
      test_bson_json_int32_cold_6();
LAB_00132202:
      pcStack_b88 = (code *)0x132207;
      test_bson_json_int32_cold_7();
      pcStack_b88 = (code *)0x13220c;
      test_bson_json_int32_cold_10();
      pcStack_b88 = (code *)0x132211;
      test_bson_json_int32_cold_11();
      pcStack_b88 = (code *)0x132216;
      test_bson_json_int32_cold_14();
      pcStack_b88 = (code *)0x13221b;
      test_bson_json_int32_cold_15();
      goto LAB_0013221b;
    }
    pcStack_b88 = (code *)0x132058;
    iVar2 = bson_iter_type(auStack_b80);
    if (iVar2 != 0x10) goto LAB_001321f8;
    pcStack_b88 = (code *)0x132069;
    iVar2 = bson_iter_int32(auStack_b80);
    if (iVar2 != 0x7fffffff) goto LAB_00132228;
    pcVar6 = acStack_b00;
    pcStack_b88 = (code *)0x132084;
    bson_destroy(pcVar6);
    pcStack_b88 = (code *)0x1320a2;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_a18);
    if (cVar1 == '\0') goto LAB_00132230;
    pcStack_b88 = (code *)0x1320c1;
    cVar1 = bson_iter_init_find(auStack_b80,acStack_b00,"x");
    if (cVar1 == '\0') goto LAB_001321fd;
    pcStack_b88 = (code *)0x1320d1;
    iVar2 = bson_iter_type(auStack_b80);
    if (iVar2 != 0x10) goto LAB_00132202;
    pcStack_b88 = (code *)0x1320e2;
    bson_iter_int32(auStack_b80);
  }
  pcStack_b88 = (code *)0x132245;
  test_bson_json_int32_cold_8();
  pcStack_b88 = (code *)0x132252;
  test_bson_json_int32_cold_9();
  pcStack_b88 = (code *)0x13225a;
  test_bson_json_int32_cold_12();
  pcStack_b88 = (code *)0x132267;
  test_bson_json_int32_cold_13();
  pcStack_b88 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_f88 = (code *)0x1322a4;
  pcStack_b98 = pcVar6;
  pvStack_b90 = unaff_R14;
  pcStack_b88 = (code *)&pcStack_788;
  cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_e20);
  if (cVar1 == '\0') {
LAB_0013253d:
    pcStack_f88 = (code *)0x13254a;
    test_bson_json_int64_cold_1();
LAB_0013254a:
    pcStack_f88 = (code *)0x132552;
    test_bson_json_int64_cold_4();
LAB_00132552:
    pcStack_f88 = (code *)0x13255f;
    test_bson_json_int64_cold_5();
LAB_0013255f:
    pcStack_f88 = (code *)0x132567;
    test_bson_json_int64_cold_8();
LAB_00132567:
    pcStack_f88 = (code *)0x13256c;
    test_bson_json_int64_cold_9();
LAB_0013256c:
    pcStack_f88 = (code *)0x132571;
    test_bson_json_int64_cold_10();
LAB_00132571:
    pcStack_f88 = (code *)0x132579;
    test_bson_json_int64_cold_23();
LAB_00132579:
    pcStack_f88 = (code *)0x13257e;
    test_bson_json_int64_cold_11();
LAB_0013257e:
    pcStack_f88 = (code *)0x132583;
    test_bson_json_int64_cold_12();
LAB_00132583:
    pcStack_f88 = (code *)0x13258b;
    test_bson_json_int64_cold_21();
LAB_0013258b:
    pcStack_f88 = (code *)0x132590;
    test_bson_json_int64_cold_13();
LAB_00132590:
    pcStack_f88 = (code *)0x132595;
    test_bson_json_int64_cold_14();
LAB_00132595:
    pcStack_f88 = (code *)0x13259d;
    test_bson_json_int64_cold_19();
LAB_0013259d:
    pcStack_f88 = (code *)0x1325a2;
    test_bson_json_int64_cold_15();
LAB_001325a2:
    pcStack_f88 = (code *)0x1325a7;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_f88 = (code *)0x1322c3;
    cVar1 = bson_iter_init_find(auStack_f80,acStack_f00,"x");
    if (cVar1 == '\0') {
      pcStack_f88 = (code *)0x13251a;
      test_bson_json_int64_cold_2();
LAB_0013251a:
      pcStack_f88 = (code *)0x13251f;
      test_bson_json_int64_cold_3();
LAB_0013251f:
      pcStack_f88 = (code *)0x132524;
      test_bson_json_int64_cold_6();
LAB_00132524:
      pcStack_f88 = (code *)0x132529;
      test_bson_json_int64_cold_7();
LAB_00132529:
      pcStack_f88 = (code *)0x13252e;
      test_bson_json_int64_cold_24();
LAB_0013252e:
      pcStack_f88 = (code *)0x132533;
      test_bson_json_int64_cold_22();
LAB_00132533:
      pcStack_f88 = (code *)0x132538;
      test_bson_json_int64_cold_20();
LAB_00132538:
      pcStack_f88 = (code *)0x13253d;
      test_bson_json_int64_cold_18();
      goto LAB_0013253d;
    }
    pcStack_f88 = (code *)0x1322d3;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x12) goto LAB_0013251a;
    unaff_R14 = (void *)0x7fffffffffffffff;
    pcStack_f88 = (code *)0x1322ee;
    lVar11 = bson_iter_int64(auStack_f80);
    if (lVar11 != 0x7fffffffffffffff) goto LAB_0013254a;
    pcVar6 = acStack_f00;
    pcStack_f88 = (code *)0x132307;
    bson_destroy(pcVar6);
    pcStack_f88 = (code *)0x132325;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 == '\0') goto LAB_00132552;
    pcStack_f88 = (code *)0x132344;
    cVar1 = bson_iter_init_find(auStack_f80,acStack_f00,"x");
    if (cVar1 == '\0') goto LAB_0013251f;
    pcStack_f88 = (code *)0x132354;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x12) goto LAB_00132524;
    pcStack_f88 = (code *)0x132365;
    lVar11 = bson_iter_int64(auStack_f80);
    unaff_R14 = (void *)0x8000000000000000;
    if (lVar11 != -0x8000000000000000) goto LAB_0013255f;
    pcVar6 = acStack_f00;
    pcStack_f88 = (code *)0x132381;
    bson_destroy(pcVar6);
    pcStack_f88 = (code *)0x13239f;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 != '\0') goto LAB_00132529;
    if (iStack_e20 != 1) goto LAB_00132567;
    if (iStack_e1c != 2) goto LAB_0013256c;
    pcVar6 = acStack_e18;
    pcStack_f88 = (code *)0x1323de;
    pcVar10 = strstr(pcVar6,"Number \"9223372036854775808\" is out of range");
    if (pcVar10 == (char *)0x0) goto LAB_00132571;
    pcStack_f88 = (code *)0x13240a;
    cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 != '\0') goto LAB_0013252e;
    if (iStack_e20 != 1) goto LAB_00132579;
    if (iStack_e1c != 2) goto LAB_0013257e;
    pcStack_f88 = (code *)0x132441;
    pcVar10 = strstr(pcVar6,"Number \"-9223372036854775809\" is out of range");
    if (pcVar10 == (char *)0x0) goto LAB_00132583;
    pcStack_f88 = (code *)0x13246d;
    cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 != '\0') goto LAB_00132533;
    if (iStack_e20 != 1) goto LAB_0013258b;
    if (iStack_e1c != 2) goto LAB_00132590;
    pcStack_f88 = (code *)0x1324a4;
    pcVar10 = strstr(pcVar6,"Number \"10000000000000000000\" is out of range");
    if (pcVar10 == (char *)0x0) goto LAB_00132595;
    pcStack_f88 = (code *)0x1324d0;
    cVar1 = bson_init_from_json(acStack_f00,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_e20);
    if (cVar1 != '\0') goto LAB_00132538;
    if (iStack_e20 != 1) goto LAB_0013259d;
    if (iStack_e1c != 2) goto LAB_001325a2;
    pcStack_f88 = (code *)0x132503;
    pcVar10 = strstr(pcVar6,"Number \"-10000000000000000000\" is out of range");
    if (pcVar10 != (char *)0x0) {
      return;
    }
  }
  pcStack_f88 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_1388 = (code *)0x1325e2;
  pcStack_f90 = pcVar6;
  pcStack_f88 = (code *)&pcStack_b88;
  cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": 1 }",0xffffffffffffffff,auStack_1218);
  if (cVar1 == '\0') {
LAB_00132887:
    pcStack_1388 = (code *)0x132894;
    test_bson_json_double_cold_1();
LAB_00132894:
    pcStack_1388 = (code *)0x13289c;
    test_bson_json_double_cold_4();
LAB_0013289c:
    pcStack_1388 = (code *)0x1328a9;
    test_bson_json_double_cold_5();
LAB_001328a9:
    pcStack_1388 = (code *)0x1328b1;
    test_bson_json_double_cold_8();
LAB_001328b1:
    pcStack_1388 = (code *)0x1328be;
    test_bson_json_double_cold_9();
LAB_001328be:
    pcStack_1388 = (code *)0x1328c6;
    test_bson_json_double_cold_12();
LAB_001328c6:
    pcStack_1388 = (code *)0x1328d3;
    test_bson_json_double_cold_13();
LAB_001328d3:
    pcStack_1388 = (code *)0x1328db;
    test_bson_json_double_cold_16();
LAB_001328db:
    pcStack_1388 = (code *)0x1328e8;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_1388 = (code *)0x132601;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') {
      pcStack_1388 = (code *)0x132855;
      test_bson_json_double_cold_2();
LAB_00132855:
      pcStack_1388 = (code *)0x13285a;
      test_bson_json_double_cold_3();
LAB_0013285a:
      pcStack_1388 = (code *)0x13285f;
      test_bson_json_double_cold_6();
LAB_0013285f:
      pcStack_1388 = (code *)0x132864;
      test_bson_json_double_cold_7();
LAB_00132864:
      pcStack_1388 = (code *)0x132869;
      test_bson_json_double_cold_10();
LAB_00132869:
      pcStack_1388 = (code *)0x13286e;
      test_bson_json_double_cold_11();
LAB_0013286e:
      pcStack_1388 = (code *)0x132873;
      test_bson_json_double_cold_14();
LAB_00132873:
      pcStack_1388 = (code *)0x132878;
      test_bson_json_double_cold_15();
LAB_00132878:
      pcStack_1388 = (code *)0x13287d;
      test_bson_json_double_cold_18();
LAB_0013287d:
      pcStack_1388 = (code *)0x132882;
      test_bson_json_double_cold_19();
LAB_00132882:
      pcStack_1388 = (code *)0x132887;
      test_bson_json_double_cold_21();
      goto LAB_00132887;
    }
    pcStack_1388 = (code *)0x132611;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x10) goto LAB_00132855;
    pcStack_1388 = (code *)0x132622;
    iVar2 = bson_iter_int32(auStack_1380);
    if (iVar2 != 1) goto LAB_00132894;
    pcVar6 = acStack_1300;
    pcStack_1388 = (code *)0x13263b;
    bson_destroy(pcVar6);
    pcStack_1388 = (code *)0x132659;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_0013289c;
    pcStack_1388 = (code *)0x132678;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_0013285a;
    pcStack_1388 = (code *)0x132688;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x12) goto LAB_0013285f;
    pcStack_1388 = (code *)0x132699;
    lVar11 = bson_iter_int64(auStack_1380);
    if (lVar11 != 0x100000000) goto LAB_001328a9;
    pcVar6 = acStack_1300;
    pcStack_1388 = (code *)0x1326bc;
    bson_destroy(pcVar6);
    pcStack_1388 = (code *)0x1326da;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_001328b1;
    pcStack_1388 = (code *)0x1326f9;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_00132864;
    pcStack_1388 = (code *)0x132709;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 1) goto LAB_00132869;
    pcStack_1388 = (code *)0x13271a;
    dVar25 = (double)bson_iter_double(auStack_1380);
    if ((dVar25 != 1.0) || (NAN(dVar25))) goto LAB_001328be;
    pcVar6 = acStack_1300;
    pcStack_1388 = (code *)0x13273e;
    bson_destroy(pcVar6);
    pcStack_1388 = (code *)0x13275c;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_001328c6;
    pcStack_1388 = (code *)0x13277b;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_0013286e;
    pcStack_1388 = (code *)0x13278b;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 1) goto LAB_00132873;
    pcStack_1388 = (code *)0x13279c;
    dVar25 = (double)bson_iter_double(auStack_1380);
    if ((dVar25 != 0.0) || (NAN(dVar25))) goto LAB_001328d3;
    pcVar6 = acStack_1300;
    pcStack_1388 = (code *)0x1327c0;
    bson_destroy(pcVar6);
    pcStack_1388 = (code *)0x1327de;
    cVar1 = bson_init_from_json(pcVar6,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_001328db;
    pcStack_1388 = (code *)0x1327fd;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_00132878;
    pcStack_1388 = (code *)0x132809;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 1) goto LAB_0013287d;
    pcStack_1388 = (code *)0x132816;
    dVar25 = (double)bson_iter_double(auStack_1380);
    if ((dVar25 == 0.0) && (!NAN(dVar25))) {
      pcStack_1388 = (code *)0x132832;
      bson_iter_double(auStack_1380);
      if (extraout_XMM0_Db < 0) {
        pcStack_1388 = (code *)0x132849;
        bson_destroy(acStack_1300);
        return;
      }
      goto LAB_00132882;
    }
  }
  pcStack_1388 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar10 = "2e400";
  ppuVar23 = &PTR_anon_var_dwarf_1affa_00161308;
  pcStack_13b0 = pcVar6;
  uStack_13a8 = unaff_R12;
  puStack_13a0 = unaff_R13;
  pvStack_1398 = unaff_R14;
  pvStack_1390 = unaff_R15;
  pcStack_1388 = (code *)&pcStack_f88;
  while( true ) {
    pcStack_1708 = (code *)0x13292e;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar10);
    pcStack_1708 = (code *)0x13294b;
    cVar1 = bson_init_from_json(auStack_1500,uVar5,0xffffffffffffffff,&iStack_1700);
    if (cVar1 != '\0') break;
    if (iStack_1700 != 1) goto LAB_00132a15;
    if (iStack_16fc != 2) goto LAB_00132a10;
    pcStack_1708 = (code *)0x132979;
    pcVar6 = strstr(acStack_16f8,"out of range");
    if (pcVar6 == (char *)0x0) goto LAB_00132a1a;
    pcStack_1708 = (code *)0x13298a;
    bson_free(uVar5);
    pcStack_1708 = (code *)0x13299b;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar10);
    pcStack_1708 = (code *)0x1329b8;
    cVar1 = bson_init_from_json(auStack_1500,uVar5,0xffffffffffffffff,&iStack_1700);
    if (cVar1 != '\0') goto LAB_00132a0b;
    if (iStack_1700 != 1) goto LAB_00132a29;
    if (iStack_16fc != 2) goto LAB_00132a24;
    pcStack_1708 = (code *)0x1329da;
    pcVar6 = strstr(acStack_16f8,"out of range");
    if (pcVar6 == (char *)0x0) goto LAB_00132a2e;
    pcStack_1708 = (code *)0x1329e7;
    bson_free(uVar5);
    pcVar10 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
    if (pcVar10 == (char *)0x0) {
      return;
    }
  }
  pcStack_1708 = (code *)0x132a0b;
  test_bson_json_double_overflow_cold_8();
LAB_00132a0b:
  pcStack_1708 = (code *)0x132a10;
  test_bson_json_double_overflow_cold_6();
LAB_00132a10:
  pcStack_1708 = (code *)0x132a15;
  test_bson_json_double_overflow_cold_2();
LAB_00132a15:
  pcStack_1708 = (code *)0x132a1a;
  test_bson_json_double_overflow_cold_1();
LAB_00132a1a:
  pcStack_1708 = (code *)0x132a24;
  test_bson_json_double_overflow_cold_7();
LAB_00132a24:
  pcStack_1708 = (code *)0x132a29;
  test_bson_json_double_overflow_cold_4();
LAB_00132a29:
  pcStack_1708 = (code *)0x132a2e;
  test_bson_json_double_overflow_cold_3();
LAB_00132a2e:
  pcStack_1708 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_1720 = "out of range";
  pcVar20 = "{ \"d\": NaN }";
  ppuVar22 = &PTR_anon_var_dwarf_1b04e_00161328;
  piVar18 = aiStack_1a80;
  piVar12 = &iStack_19b8;
  piVar24 = (int *)0x14a6f6;
  pcVar6 = (char *)&dStack_1a88;
  uStack_1730 = uVar5;
  puStack_1728 = (undefined1 *)&iStack_1700;
  pcStack_1718 = pcVar10;
  ppuStack_1710 = ppuVar23;
  pcStack_1708 = (code *)&pcStack_1388;
  do {
    apcStack_1b08[0] = (code *)0x132a8c;
    cVar1 = bson_init_from_json(piVar18,pcVar20,0xffffffffffffffff,piVar12);
    if (cVar1 == '\0') {
      apcStack_1b08[0] = (code *)0x132bf5;
      test_bson_json_nan_cold_1();
LAB_00132bf5:
      apcStack_1b08[0] = (code *)0x132bfa;
      test_bson_json_nan_cold_2();
LAB_00132bfa:
      apcStack_1b08[0] = (code *)0x132bff;
      test_bson_json_nan_cold_3();
      goto LAB_00132bff;
    }
    apcStack_1b08[0] = (code *)0x132a99;
    uVar5 = bson_bcone_magic();
    apcStack_1b08[0] = (code *)0x132ab4;
    cVar1 = bcon_extract(piVar18,"d",uVar5,1,pcVar6,0);
    if (cVar1 == '\0') goto LAB_00132bf5;
    if (!NAN(dStack_1a88) && !NAN(dStack_1a88)) goto LAB_00132bfa;
    apcStack_1b08[0] = (code *)0x132ad4;
    bson_destroy(piVar18);
    pcVar20 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
  } while (pcVar20 != (char *)0x0);
  pcVar10 = "{ \"d\": NaNn }";
  ppuVar22 = &PTR_anon_var_dwarf_1b07e_00161358;
  piVar18 = aiStack_19b0;
  piVar12 = aiStack_1a80;
  piVar24 = &iStack_19b8;
  pcVar6 = "Got parse error at";
  do {
    apcStack_1b08[0] = (code *)0x132b20;
    cVar1 = bson_init_from_json(piVar12,pcVar10,0xffffffffffffffff,piVar24);
    if (cVar1 != '\0') goto LAB_00132bff;
    if (iStack_19b8 != 1) goto LAB_00132c16;
    if (iStack_19b4 != 1) goto LAB_00132c09;
    apcStack_1b08[0] = (code *)0x132b53;
    pcVar10 = strstr((char *)piVar18,"Got parse error at");
    if (pcVar10 == (char *)0x0) goto LAB_00132c0e;
    pcVar10 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
  } while (pcVar10 != (char *)0x0);
  pcVar10 = "{ \"d\": nu";
  ppuVar22 = &PTR_anon_var_dwarf_1b0c6_00161398;
  piVar18 = aiStack_19b0;
  piVar12 = aiStack_1a80;
  piVar24 = &iStack_19b8;
  pcVar6 = "Incomplete JSON";
  while( true ) {
    apcStack_1b08[0] = (code *)0x132ba8;
    cVar1 = bson_init_from_json(piVar12,pcVar10,0xffffffffffffffff,piVar24);
    if (cVar1 != '\0') break;
    if (iStack_19b8 != 1) goto LAB_00132c28;
    if (iStack_19b4 != 1) goto LAB_00132c1b;
    apcStack_1b08[0] = (code *)0x132bcf;
    pcVar10 = strstr((char *)piVar18,"Incomplete JSON");
    if (pcVar10 == (char *)0x0) goto LAB_00132c20;
    pcVar10 = *ppuVar22;
    ppuVar22 = ppuVar22 + 1;
    if (pcVar10 == (char *)0x0) {
      return;
    }
  }
  goto LAB_00132c04;
LAB_00132bff:
  apcStack_1b08[0] = (code *)0x132c04;
  test_bson_json_nan_cold_11();
LAB_00132c04:
  apcStack_1b08[0] = (code *)0x132c09;
  test_bson_json_nan_cold_9();
LAB_00132c09:
  apcStack_1b08[0] = (code *)0x132c0e;
  test_bson_json_nan_cold_5();
LAB_00132c0e:
  apcStack_1b08[0] = (code *)0x132c16;
  test_bson_json_nan_cold_10();
LAB_00132c16:
  apcStack_1b08[0] = (code *)0x132c1b;
  test_bson_json_nan_cold_4();
LAB_00132c1b:
  apcStack_1b08[0] = (code *)0x132c20;
  test_bson_json_nan_cold_7();
LAB_00132c20:
  apcStack_1b08[0] = (code *)0x132c28;
  test_bson_json_nan_cold_8();
LAB_00132c28:
  apcStack_1b08[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar10 = "{ \"d\": Infinity }";
  ppuVar23 = &PTR_anon_var_dwarf_1b13e_001613b8;
  piStack_1b30 = piVar18;
  pdStack_1b28 = (double *)pcVar6;
  ppuStack_1b20 = ppuVar22;
  piStack_1b18 = piVar12;
  piStack_1b10 = piVar24;
  apcStack_1b08[0] = (code *)&pcStack_1708;
  do {
    apcStack_1f08[0] = (code *)0x132c81;
    cVar1 = bson_init_from_json(aiStack_1e80,pcVar10,0xffffffffffffffff,&iStack_1db8);
    if (cVar1 == '\0') {
      apcStack_1f08[0] = (code *)0x132eb1;
      test_bson_json_infinity_cold_1();
LAB_00132eb1:
      apcStack_1f08[0] = (code *)0x132eb6;
      test_bson_json_infinity_cold_2();
LAB_00132eb6:
      apcStack_1f08[0] = (code *)0x132ebb;
      test_bson_json_infinity_cold_3();
      goto LAB_00132ebb;
    }
    apcStack_1f08[0] = (code *)0x132c8e;
    uVar5 = bson_bcone_magic();
    apcStack_1f08[0] = (code *)0x132ca9;
    cVar1 = bcon_extract(aiStack_1e80,"d",uVar5,1,&dStack_1e88,0);
    if (cVar1 == '\0') goto LAB_00132eb1;
    if ((NAN(dStack_1e88)) || (!NAN(dStack_1e88 - dStack_1e88) && !NAN(dStack_1e88 - dStack_1e88)))
    goto LAB_00132eb6;
    apcStack_1f08[0] = (code *)0x132cd7;
    bson_destroy(aiStack_1e80);
    pcVar10 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar10 != (char *)0x0);
  pcVar6 = "{ \"d\": -Infinity }";
  ppuVar23 = &PTR_anon_var_dwarf_1b162_001613d8;
  do {
    apcStack_1f08[0] = (code *)0x132d20;
    cVar1 = bson_init_from_json(aiStack_1e80,pcVar6,0xffffffffffffffff,&iStack_1db8);
    if (cVar1 == '\0') goto LAB_00132ebb;
    apcStack_1f08[0] = (code *)0x132d2d;
    uVar5 = bson_bcone_magic();
    apcStack_1f08[0] = (code *)0x132d48;
    cVar1 = bcon_extract(aiStack_1e80,"d",uVar5,1,&dStack_1e88,0);
    if (cVar1 == '\0') goto LAB_00132ec0;
    if ((NAN(dStack_1e88)) || (!NAN(dStack_1e88 - dStack_1e88))) goto LAB_00132ec5;
    if (0.0 <= dStack_1e88) goto LAB_00132eca;
    apcStack_1f08[0] = (code *)0x132d88;
    bson_destroy(aiStack_1e80);
    pcVar6 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar6 != (char *)0x0);
  pcVar10 = "{ \"d\": Infinityy }";
  ppuVar23 = &PTR_anon_var_dwarf_1b186_001613f8;
  piVar18 = aiStack_1db0;
  piVar12 = aiStack_1e80;
  piVar24 = &iStack_1db8;
  pcVar6 = "Got parse error at";
  do {
    apcStack_1f08[0] = (code *)0x132dd8;
    cVar1 = bson_init_from_json(piVar12,pcVar10,0xffffffffffffffff,piVar24);
    if (cVar1 != '\0') goto LAB_00132ecf;
    if (iStack_1db8 != 1) goto LAB_00132ee6;
    if (iStack_1db4 != 1) goto LAB_00132ed9;
    apcStack_1f08[0] = (code *)0x132e0b;
    pcVar10 = strstr((char *)piVar18,"Got parse error at");
    if (pcVar10 == (char *)0x0) goto LAB_00132ede;
    pcVar10 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
  } while (pcVar10 != (char *)0x0);
  pcVar10 = "{ \"d\": In";
  ppuVar23 = &PTR_anon_var_dwarf_1b1e6_00161448;
  piVar18 = aiStack_1db0;
  piVar12 = aiStack_1e80;
  piVar24 = &iStack_1db8;
  pcVar6 = "Incomplete JSON";
  while( true ) {
    apcStack_1f08[0] = (code *)0x132e60;
    cVar1 = bson_init_from_json(piVar12,pcVar10,0xffffffffffffffff,piVar24);
    if (cVar1 != '\0') break;
    if (iStack_1db8 != 1) goto LAB_00132ef8;
    if (iStack_1db4 != 1) goto LAB_00132eeb;
    apcStack_1f08[0] = (code *)0x132e8b;
    pcVar10 = strstr((char *)piVar18,"Incomplete JSON");
    if (pcVar10 == (char *)0x0) goto LAB_00132ef0;
    pcVar10 = *ppuVar23;
    ppuVar23 = ppuVar23 + 1;
    if (pcVar10 == (char *)0x0) {
      return;
    }
  }
LAB_00132ed4:
  apcStack_1f08[0] = (code *)0x132ed9;
  test_bson_json_infinity_cold_13();
LAB_00132ed9:
  apcStack_1f08[0] = (code *)0x132ede;
  test_bson_json_infinity_cold_9();
LAB_00132ede:
  apcStack_1f08[0] = (code *)0x132ee6;
  test_bson_json_infinity_cold_14();
LAB_00132ee6:
  apcStack_1f08[0] = (code *)0x132eeb;
  test_bson_json_infinity_cold_8();
LAB_00132eeb:
  apcStack_1f08[0] = (code *)0x132ef0;
  test_bson_json_infinity_cold_11();
LAB_00132ef0:
  apcStack_1f08[0] = (code *)0x132ef8;
  test_bson_json_infinity_cold_12();
LAB_00132ef8:
  apcStack_1f08[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_2288 = (code *)0x132f2a;
  apcStack_1f08[0] = (code *)apcStack_1b08;
  cVar1 = bson_init_from_json(auStack_2280,"{ \"x\": null }",0xffffffffffffffff,auStack_2190);
  if (cVar1 == '\0') {
    pcStack_2288 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_2288 = (code *)0x132f33;
    uVar5 = bson_bcone_magic();
    pcStack_2288 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_2280,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_2288 = (code *)0x132f5b;
      bson_destroy(auStack_2280);
      return;
    }
  }
  pcStack_2288 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_2688 = (code *)0x0;
  pcStack_2690 = "}";
  acStack_26a0[8] = -0x52;
  acStack_26a0[9] = '/';
  acStack_26a0[10] = '\x13';
  acStack_26a0[0xb] = '\0';
  acStack_26a0[0xc] = '\0';
  acStack_26a0[0xd] = '\0';
  acStack_26a0[0xe] = '\0';
  acStack_26a0[0xf] = '\0';
  piStack_22b0 = piVar18;
  pdStack_22a8 = (double *)pcVar6;
  ppuStack_22a0 = ppuVar23;
  piStack_2298 = piVar12;
  piStack_2290 = piVar24;
  pcStack_2288 = (code *)apcStack_1f08;
  uVar17 = bcon_new(0,"a","{","b","{");
  uStack_2590 = 0;
  uStack_2588 = 0;
  uStack_25a0 = 0;
  uStack_2598 = 0;
  uStack_25b0 = 0;
  uStack_25a8 = 0;
  uStack_25c0 = 0;
  uStack_25b8 = 0;
  uStack_25d0 = 0;
  uStack_25c8 = 0;
  uStack_25e0 = 0;
  uStack_25d8 = 0;
  uStack_25f0 = 0;
  uStack_25e8 = 0;
  uStack_2600 = (undefined *)0x500000003;
  uStack_25f8 = 5;
  pcStack_2688 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_2600,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_2538);
  if (cVar1 != '\0') {
    pcStack_2688 = (code *)0x133023;
    piVar24 = (int *)bson_get_data(&uStack_2600);
    pcStack_2688 = (code *)0x13302e;
    piVar12 = (int *)bson_get_data(uVar17);
    if (*(int *)(uVar17 + 4) == uStack_2600._4_4_) {
      pcStack_2688 = (code *)0x133043;
      pvVar7 = (void *)bson_get_data(uVar17);
      pcStack_2688 = (code *)0x133053;
      pvVar8 = (void *)bson_get_data(&uStack_2600);
      pcStack_2688 = (code *)0x133061;
      iVar2 = bcmp(pvVar7,pvVar8,(ulong)*(uint *)(uVar17 + 4));
      if (iVar2 == 0) {
        pcStack_2688 = (code *)0x133072;
        bson_destroy(&uStack_2600);
        pcStack_2688 = (code *)0x13307a;
        bson_destroy(uVar17);
        return;
      }
    }
    ppuVar23 = (undefined **)&uStack_2600;
    pcStack_2688 = (code *)0x13309b;
    uVar5 = bson_as_canonical_extended_json(ppuVar23);
    pcStack_2688 = (code *)0x1330a8;
    uVar9 = bson_as_canonical_extended_json(uVar17);
    uVar19 = 0xffffffff;
    if (uStack_2600._4_4_ != 0) {
      uVar21 = 0;
      do {
        if (*(int *)(uVar17 + 4) == (int)uVar21) break;
        if (*(char *)((long)piVar24 + uVar21) != *(char *)((long)piVar12 + uVar21)) {
          uVar19 = uVar21 & 0xffffffff;
          break;
        }
        uVar21 = uVar21 + 1;
      } while (uStack_2600._4_4_ != (uint)uVar21);
    }
    if ((int)uVar19 == -1) {
      uVar3 = uStack_2600._4_4_;
      if (uStack_2600._4_4_ < *(uint *)(uVar17 + 4)) {
        uVar3 = *(uint *)(uVar17 + 4);
      }
      uVar19 = (ulong)(uVar3 - 1);
    }
    pcStack_2688 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar19,uVar5,uVar9);
    pcStack_2688 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar6 = (char *)(ulong)uVar3;
    pcStack_2688 = (code *)0x133136;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2604 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_2688 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_2688 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_2688 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      ppuVar23 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013318c;
      pcVar6 = (char *)((ulong)uStack_2600 >> 0x20);
      pcStack_2688 = (code *)0x133160;
      pdVar13 = (double *)write(uVar3,piVar24,(size_t)pcVar6);
      if (pdVar13 != (double *)pcVar6) goto LAB_00133191;
      uVar17 = (ulong)*(uint *)(uVar17 + 4);
      pcStack_2688 = (code *)0x133176;
      uVar19 = write(uVar4,piVar12,uVar17);
      if (uVar19 == uVar17) {
        pcStack_2688 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_2688 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_2688 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar10 = acStack_26a0;
  acStack_26a0[8] = '\0';
  acStack_26a0[9] = '\0';
  acStack_26a0[10] = '\0';
  acStack_26a0[0xb] = '\0';
  acStack_26a0[0xc] = '\0';
  acStack_26a0[0xd] = '\0';
  acStack_26a0[0xe] = '@';
  acStack_26a0[0xf] = '0';
  acStack_26a0[0] = '\v';
  acStack_26a0[1] = '\0';
  acStack_26a0[2] = '\0';
  acStack_26a0[3] = '\0';
  acStack_26a0[4] = '\0';
  acStack_26a0[5] = '\0';
  acStack_26a0[6] = '\0';
  acStack_26a0[7] = '\0';
  pcStack_26b0 = (code *)0x1331ce;
  pcStack_2690 = (char *)uVar17;
  pcStack_2688 = (code *)piVar12;
  plVar14 = (long *)bson_new();
  pcStack_26b0 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar14,"decimal128",0xffffffff,pcVar10);
  if (cVar1 == '\0') {
    pcStack_26b0 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_26b0 = (code *)0x1331f7;
    pcVar10 = (char *)bson_as_json(plVar14,auStack_26a8);
    if (pcVar10 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_26b0 = (code *)0x133221;
      bson_free(pcVar10);
      pcStack_26b0 = (code *)0x133229;
      bson_destroy(plVar14);
      return;
    }
    pcStack_26b0 = (code *)0x133215;
    iVar2 = strcmp(pcVar10,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_26b0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar26 = &pcStack_26b0;
  pcStack_2b08 = (code *)0x133271;
  plStack_26b8 = plVar14;
  pcStack_26b0 = (code *)&pcStack_2288;
  cVar1 = bson_init_from_json(auStack_2a00,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_2918);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_2b08 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_2a80,auStack_2a00);
  if (cVar1 == '\0') {
    pcStack_2b08 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_2b08 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_2b08 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_2b08 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_2b08 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_2a80,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_2b08 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_2a80);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar14 = &lStack_2a90;
    pcStack_2b08 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_2a80,plVar14);
    if (lStack_2a90 != 0xb) goto LAB_0013330b;
    if (lStack_2a88 == 0x3040000000000000) {
      pcStack_2b08 = (code *)0x1332f5;
      bson_destroy(auStack_2a00);
      return;
    }
  }
  pcStack_2b08 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_2b08 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar20 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar22 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_2b20 = plVar14;
  pdStack_2b18 = (double *)pcVar6;
  pcStack_2b10 = pcVar10;
  pcStack_2b08 = (code *)piVar24;
  do {
    pcStack_2d30 = (code *)0x133357;
    lVar11 = bson_new_from_json(pcVar20,0xffffffffffffffff,&iStack_2d20);
    if (lVar11 != 0) {
      pcStack_2d30 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_2d30 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_2d18,
              piVar24);
      pcStack_2d30 = (code *)0x1333c7;
      abort();
    }
    if (iStack_2d20 != 1) {
LAB_001333cc:
      pcStack_2d30 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_2f48 = (code *)0x1333f1;
      pcStack_2d38 = acStack_2d18;
      pcStack_2d30 = (code *)&iStack_2d20;
      pcVar6 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_2f38);
      pcStack_2f48 = (code *)0x1333fe;
      pcVar10 = (char *)bson_as_json(pcVar6,0);
      if (pcVar10 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_2f48 = (code *)0x133428;
        bson_free(pcVar10);
        pcStack_2f48 = (code *)0x133430;
        bson_destroy(pcVar6);
        return;
      }
      pcStack_2f48 = (code *)0x13341c;
      iVar2 = strcmp(pcVar10,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_2f48 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_3158 = 0x2200223a2261227b;
      uStack_3150 = 0x7d;
      uStack_315c = 0x227b;
      pcStack_2f48 = (code *)pcVar6;
      lVar11 = bson_new_from_json(&uStack_3158,9,&iStack_3148);
      if (lVar11 == 0) {
        if (iStack_3148 != 1) goto LAB_001334fc;
        if (iStack_3144 != 1) goto LAB_00133501;
        pcVar6 = acStack_3140;
        pcVar20 = strstr(pcVar6,"Got parse error");
        if (pcVar20 == (char *)0x0) goto LAB_00133506;
        lVar11 = bson_new_from_json(&uStack_315c,3,&iStack_3148);
        if (lVar11 != 0) goto LAB_001334f7;
        if (iStack_3148 != 1) goto LAB_0013350e;
        if (iStack_3144 == 1) {
          pcVar20 = strstr(pcVar6,"Got parse error");
          if (pcVar20 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar9 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0,uVar5,pcVar6,ppuVar22,ppuVar23,pcVar10,piVar24,ppcVar26);
      uVar15 = bcon_new(0,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar15,0);
      uVar5 = bson_new();
      uVar15 = bson_new();
      uVar16 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar15,uVar16,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar9,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_2d1c != 2) {
      pcStack_2d30 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    piVar24 = (int *)ppuVar22[-1];
    pcStack_2d30 = (code *)0x13337e;
    pcVar6 = strstr(acStack_2d18,(char *)piVar24);
    if (pcVar6 == (char *)0x0) goto LAB_001333a4;
    pcVar20 = *ppuVar22;
    ppuVar22 = ppuVar22 + 2;
    if (pcVar20 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00132ebb:
  apcStack_1f08[0] = (code *)0x132ec0;
  test_bson_json_infinity_cold_4();
LAB_00132ec0:
  apcStack_1f08[0] = (code *)0x132ec5;
  test_bson_json_infinity_cold_5();
LAB_00132ec5:
  apcStack_1f08[0] = (code *)0x132eca;
  test_bson_json_infinity_cold_6();
LAB_00132eca:
  piVar12 = &iStack_1db8;
  pcVar6 = (char *)&dStack_1e88;
  piVar18 = aiStack_1e80;
  piVar24 = (int *)0x14a6f6;
  apcStack_1f08[0] = (code *)0x132ecf;
  test_bson_json_infinity_cold_7();
LAB_00132ecf:
  apcStack_1f08[0] = (code *)0x132ed4;
  test_bson_json_infinity_cold_15();
  goto LAB_00132ed4;
}

Assistant:

static void
test_bson_json_uescape_key (void)
{
   bson_error_t error;
   bson_t b;
   bool r;

   bson_t *bson_euro = BCON_NEW ("\xE2\x82\xAC", BCON_UTF8 ("euro"));

   r = bson_init_from_json (&b, "{ \"\\u20AC\": \"euro\"}", -1, &error);
   BSON_ASSERT (r);
   bson_eq_bson (&b, bson_euro);

   bson_destroy (&b);
   bson_destroy (bson_euro);
}